

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void run_static_context_tests(int use_prealloc)

{
  char *pcVar1;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar2;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  void *__s;
  long lVar3;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *psVar4;
  code *extraout_RAX_06;
  code *pcVar5;
  void *unaff_RBX;
  uchar *p;
  secp256k1_context *unaff_R14;
  bool bVar6;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar seed [32];
  undefined1 local_5c [12];
  void *pvStack_50;
  ulong local_48;
  uint64_t auStack_40 [4];
  
  psVar2 = STATIC_CTX;
  psVar4 = secp256k1_context_static;
  if (secp256k1_context_no_precomp == secp256k1_context_static) {
    unaff_RBX = (void *)(ulong)(uint)use_prealloc;
    auStack_40[1] = 0;
    auStack_40[2] = 0;
    local_48 = 0x17;
    auStack_40[0] = 0;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (STATIC_CTX->illegal_callback).fn;
    pvStack_50 = (STATIC_CTX->illegal_callback).data;
    if (secp256k1_context_static == STATIC_CTX) goto LAB_0013a4db;
    (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
    psVar4 = (secp256k1_context *)local_5c;
    (psVar2->illegal_callback).data = psVar4;
  }
  else {
    run_static_context_tests_cold_1();
    psVar2 = extraout_RAX_00;
LAB_0013a4db:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
  }
  if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
    run_static_context_tests_cold_2();
    psVar2 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar2->illegal_callback).data = pvStack_50;
    if (local_5c._0_4_ != 1) goto LAB_0013a503;
    psVar4 = (secp256k1_context *)&psVar2->illegal_callback;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = ((secp256k1_callback *)psVar4)->fn;
    pvStack_50 = (psVar2->illegal_callback).data;
    if (secp256k1_context_static == psVar2) goto LAB_0013a508;
    (psVar2->illegal_callback).fn = counting_callback_fn;
    psVar4 = (secp256k1_context *)local_5c;
    (psVar2->illegal_callback).data = psVar4;
  }
  else {
    secp256k1_ecmult_gen_blind(&STATIC_CTX->ecmult_gen_ctx,(uchar *)&local_48);
    run_static_context_tests_cold_3();
LAB_0013a503:
    run_static_context_tests_cold_4();
    psVar2 = extraout_RAX_01;
LAB_0013a508:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
  }
  if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
    run_static_context_tests_cold_5();
    psVar2 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar2->illegal_callback).data = pvStack_50;
    if (local_5c._0_4_ != 1) goto LAB_0013a530;
    psVar4 = (secp256k1_context *)&psVar2->illegal_callback;
    if ((int)unaff_RBX == 0) goto LAB_0013a341;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = ((secp256k1_callback *)psVar4)->fn;
    pvStack_50 = (psVar2->illegal_callback).data;
    if (secp256k1_context_static == psVar2) goto LAB_0013a535;
    (psVar2->illegal_callback).fn = counting_callback_fn;
    psVar4 = (secp256k1_context *)local_5c;
    (psVar2->illegal_callback).data = psVar4;
  }
  else {
    secp256k1_ecmult_gen_blind(&STATIC_CTX->ecmult_gen_ctx,(uchar *)0x0);
    run_static_context_tests_cold_6();
LAB_0013a530:
    run_static_context_tests_cold_7();
    psVar2 = extraout_RAX_02;
LAB_0013a535:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
  }
  if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
    (*(STATIC_CTX->illegal_callback).fn)
              ("secp256k1_context_is_proper(ctx)",(STATIC_CTX->illegal_callback).data);
    unaff_R14 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (unaff_R14->illegal_callback).data = pvStack_50;
    if (local_5c._0_4_ != 1) goto LAB_0013a741;
    __s = malloc(0xd0);
    if (__s == (void *)0x0) goto LAB_0013a746;
    memset(__s,0x2a,0xd0);
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (unaff_R14->illegal_callback).fn;
    pvStack_50 = (unaff_R14->illegal_callback).data;
    if (secp256k1_context_static == unaff_R14) goto LAB_0013a74b;
    (unaff_R14->illegal_callback).fn = counting_callback_fn;
    (unaff_R14->illegal_callback).data = local_5c;
    goto LAB_0013a5e8;
  }
  run_static_context_tests_cold_8();
  psVar2 = extraout_RAX;
LAB_0013a341:
  local_5c._0_4_ = 0;
  local_5c._4_8_ = *(undefined8 *)&psVar4->ecmult_gen_ctx;
  pvStack_50 = (void *)(psVar4->ecmult_gen_ctx).scalar_offset.d[0];
  __s = unaff_RBX;
  if (secp256k1_context_static == psVar2) goto LAB_0013a6c5;
  (psVar2->illegal_callback).fn = counting_callback_fn;
  (psVar2->illegal_callback).data = local_5c;
  while (psVar2 = secp256k1_context_clone(STATIC_CTX), psVar4 = STATIC_CTX,
        psVar2 == (secp256k1_context *)0x0) {
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar4->illegal_callback).data = pvStack_50;
    if (local_5c._0_4_ != 1) goto LAB_0013a6e3;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (psVar4->illegal_callback).fn;
    pvStack_50 = (psVar4->illegal_callback).data;
    if (secp256k1_context_static == psVar4) goto LAB_0013a706;
    (psVar4->illegal_callback).fn = counting_callback_fn;
    (psVar4->illegal_callback).data = local_5c;
LAB_0013a3e9:
    secp256k1_context_destroy(STATIC_CTX);
    psVar4 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar4->illegal_callback).data = pvStack_50;
    if (local_5c._0_4_ != 1) {
      run_static_context_tests_cold_18();
      goto LAB_0013a724;
    }
    do {
      psVar4 = STATIC_CTX;
      local_48 = local_48 & 0xffffffff00000000;
      if (secp256k1_context_static == STATIC_CTX) {
LAB_0013a6e8:
        (*(psVar4->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
      }
      else {
        (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
        (psVar4->illegal_callback).data = &local_48;
      }
      psVar4 = STATIC_CTX;
      if ((STATIC_CTX->illegal_callback).fn != counting_callback_fn) goto LAB_0013a701;
      if ((ulong *)(STATIC_CTX->illegal_callback).data == &local_48) {
        pcVar5 = counting_callback_fn;
        if (secp256k1_context_static == STATIC_CTX) goto LAB_0013a729;
        (STATIC_CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
        (psVar4->illegal_callback).data = (void *)0x0;
      }
      else {
LAB_0013a724:
        run_static_context_tests_cold_20();
        pcVar5 = extraout_RAX_06;
LAB_0013a729:
        (*pcVar5)("ctx != secp256k1_context_static");
      }
      if ((STATIC_CTX->illegal_callback).fn == secp256k1_default_illegal_callback_fn) {
        if ((STATIC_CTX->illegal_callback).data == (void *)0x0) {
          return;
        }
      }
      else {
        run_static_context_tests_cold_21();
      }
      run_static_context_tests_cold_22();
      unaff_RBX = __s;
LAB_0013a741:
      run_static_context_tests_cold_9();
LAB_0013a746:
      __s = unaff_RBX;
      run_static_context_tests_cold_15();
LAB_0013a74b:
      (*(unaff_R14->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(unaff_R14->illegal_callback).data);
LAB_0013a5e8:
      if ((STATIC_CTX->ecmult_gen_ctx).built == 0) {
        run_static_context_tests_cold_10();
        unaff_R14 = STATIC_CTX;
        (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
        (unaff_R14->illegal_callback).data = pvStack_50;
        if (local_5c._0_4_ != 1) goto LAB_0013a777;
        lVar3 = 0;
        do {
          pcVar1 = (char *)((long)__s + lVar3);
          if (*pcVar1 != '*') break;
          bVar6 = lVar3 != 0xcf;
          lVar3 = lVar3 + 1;
        } while (bVar6);
        if (*pcVar1 != '*') goto LAB_0013a77c;
        free(__s);
        local_5c._0_4_ = 0;
        local_5c._4_8_ = (unaff_R14->illegal_callback).fn;
        pvStack_50 = (unaff_R14->illegal_callback).data;
        if (secp256k1_context_static == unaff_R14) goto LAB_0013a781;
        (unaff_R14->illegal_callback).fn = counting_callback_fn;
        (unaff_R14->illegal_callback).data = local_5c;
      }
      else {
        memcpy(__s,STATIC_CTX,0xd0);
        run_static_context_tests_cold_11();
LAB_0013a777:
        run_static_context_tests_cold_12();
LAB_0013a77c:
        run_static_context_tests_cold_14();
LAB_0013a781:
        (*(unaff_R14->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(unaff_R14->illegal_callback).data);
      }
      secp256k1_context_preallocated_destroy(STATIC_CTX);
      psVar4 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
      (psVar4->illegal_callback).data = pvStack_50;
    } while (local_5c._0_4_ == 1);
    run_static_context_tests_cold_13();
    psVar2 = extraout_RAX_03;
LAB_0013a6c5:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
  }
  run_static_context_tests_cold_16();
LAB_0013a6e3:
  run_static_context_tests_cold_17();
  psVar4 = extraout_RAX_04;
  goto LAB_0013a6e8;
LAB_0013a701:
  run_static_context_tests_cold_19();
  psVar4 = extraout_RAX_05;
LAB_0013a706:
  (*(psVar4->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
  goto LAB_0013a3e9;
}

Assistant:

static void run_static_context_tests(int use_prealloc) {
    /* Check that deprecated secp256k1_context_no_precomp is an alias to secp256k1_context_static. */
    CHECK(secp256k1_context_no_precomp == secp256k1_context_static);

    {
        unsigned char seed[32] = {0x17};

        /* Randomizing secp256k1_context_static is not supported. */
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, seed));
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, NULL));

        /* Destroying or cloning secp256k1_context_static is not supported. */
        if (use_prealloc) {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone_size(STATIC_CTX));
            {
                secp256k1_context *my_static_ctx = malloc(sizeof(*STATIC_CTX));
                CHECK(my_static_ctx != NULL);
                memset(my_static_ctx, 0x2a, sizeof(*my_static_ctx));
                CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone(STATIC_CTX, my_static_ctx));
                CHECK(all_bytes_equal(my_static_ctx, 0x2a, sizeof(*my_static_ctx)));
                free(my_static_ctx);
            }
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_preallocated_destroy(STATIC_CTX));
        } else {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_clone(STATIC_CTX));
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_destroy(STATIC_CTX));
        }
    }

    {
        /* Verify that setting and resetting illegal callback works */
        int32_t dummy = 0;
        secp256k1_context_set_illegal_callback(STATIC_CTX, counting_callback_fn, &dummy);
        CHECK(STATIC_CTX->illegal_callback.fn == counting_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == &dummy);
        secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
        CHECK(STATIC_CTX->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == NULL);
    }
}